

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O0

wchar_t * uriParseAuthorityTwoW(UriParserStateW *state,wchar_t *first,wchar_t *afterLast)

{
  wchar_t *afterPort;
  wchar_t *afterLast_local;
  wchar_t *first_local;
  UriParserStateW *state_local;
  
  state_local = (UriParserStateW *)afterLast;
  if ((first < afterLast) && (state_local = (UriParserStateW *)first, *first == L':')) {
    state_local = (UriParserStateW *)uriParsePortW(state,first + 1,afterLast);
    if (state_local == (UriParserStateW *)0x0) {
      state_local = (UriParserStateW *)0x0;
    }
    else {
      (state->uri->portText).first = first + 1;
      (state->uri->portText).afterLast = (wchar_t *)state_local;
    }
  }
  return (wchar_t *)state_local;
}

Assistant:

static URI_INLINE const URI_CHAR * URI_FUNC(ParseAuthorityTwo)(URI_TYPE(ParserState) * state, const URI_CHAR * first, const URI_CHAR * afterLast) {
	if (first >= afterLast) {
		return afterLast;
	}

	switch (*first) {
	case _UT(':'):
		{
			const URI_CHAR * const afterPort = URI_FUNC(ParsePort)(state, first + 1, afterLast);
			if (afterPort == NULL) {
				return NULL;
			}
			state->uri->portText.first = first + 1; /* PORT BEGIN */
			state->uri->portText.afterLast = afterPort; /* PORT END */
			return afterPort;
		}

	default:
		return first;
	}
}